

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline_event.cpp
# Opt level: O1

void __thiscall
duckdb::PipelineEvent::PipelineEvent
          (PipelineEvent *this,shared_ptr<duckdb::Pipeline,_true> *pipeline_p)

{
  Executor *pEVar1;
  Pipeline *pPVar2;
  shared_ptr<duckdb::Pipeline,_true> local_18;
  
  local_18.internal.super___shared_ptr<duckdb::Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (pipeline_p->internal).super___shared_ptr<duckdb::Pipeline,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_18.internal.super___shared_ptr<duckdb::Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (pipeline_p->internal).super___shared_ptr<duckdb::Pipeline,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi;
  (pipeline_p->internal).super___shared_ptr<duckdb::Pipeline,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (pipeline_p->internal).super___shared_ptr<duckdb::Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  pPVar2 = shared_ptr<duckdb::Pipeline,_true>::operator->(&local_18);
  pEVar1 = pPVar2->executor;
  (this->super_BasePipelineEvent).super_Event.super_enable_shared_from_this<duckdb::Event>.
  __weak_this_.internal.super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_BasePipelineEvent).super_Event.super_enable_shared_from_this<duckdb::Event>.
  __weak_this_.internal.super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_BasePipelineEvent).super_Event.executor = pEVar1;
  (this->super_BasePipelineEvent).super_Event.finished_tasks.super___atomic_base<unsigned_long>._M_i
       = 0;
  (this->super_BasePipelineEvent).super_Event.total_tasks.super___atomic_base<unsigned_long>._M_i =
       0;
  (this->super_BasePipelineEvent).super_Event.finished_dependencies.
  super___atomic_base<unsigned_long>._M_i = 0;
  (this->super_BasePipelineEvent).super_Event.total_dependencies = 0;
  (this->super_BasePipelineEvent).super_Event.parents.
  super_vector<duckdb::weak_ptr<duckdb::Event,_true>,_std::allocator<duckdb::weak_ptr<duckdb::Event,_true>_>_>
  .
  super__Vector_base<duckdb::weak_ptr<duckdb::Event,_true>,_std::allocator<duckdb::weak_ptr<duckdb::Event,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_BasePipelineEvent).super_Event.parents.
           super_vector<duckdb::weak_ptr<duckdb::Event,_true>,_std::allocator<duckdb::weak_ptr<duckdb::Event,_true>_>_>
           .
           super__Vector_base<duckdb::weak_ptr<duckdb::Event,_true>,_std::allocator<duckdb::weak_ptr<duckdb::Event,_true>_>_>
           ._M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_BasePipelineEvent).super_Event.parents.
           super_vector<duckdb::weak_ptr<duckdb::Event,_true>,_std::allocator<duckdb::weak_ptr<duckdb::Event,_true>_>_>
           .
           super__Vector_base<duckdb::weak_ptr<duckdb::Event,_true>,_std::allocator<duckdb::weak_ptr<duckdb::Event,_true>_>_>
           ._M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->super_BasePipelineEvent).super_Event.parents_raw.
  super_vector<std::reference_wrapper<duckdb::Event>,_std::allocator<std::reference_wrapper<duckdb::Event>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::Event>,_std::allocator<std::reference_wrapper<duckdb::Event>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_BasePipelineEvent).super_Event.parents_raw.
           super_vector<std::reference_wrapper<duckdb::Event>,_std::allocator<std::reference_wrapper<duckdb::Event>_>_>
           .
           super__Vector_base<std::reference_wrapper<duckdb::Event>,_std::allocator<std::reference_wrapper<duckdb::Event>_>_>
           ._M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_BasePipelineEvent).super_Event.parents_raw.
           super_vector<std::reference_wrapper<duckdb::Event>,_std::allocator<std::reference_wrapper<duckdb::Event>_>_>
           .
           super__Vector_base<std::reference_wrapper<duckdb::Event>,_std::allocator<std::reference_wrapper<duckdb::Event>_>_>
           ._M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->super_BasePipelineEvent).super_Event.finished._M_base._M_i = false;
  (this->super_BasePipelineEvent).super_Event._vptr_Event =
       (_func_int **)&PTR__BasePipelineEvent_019a4108;
  (this->super_BasePipelineEvent).pipeline.internal.
  super___shared_ptr<duckdb::Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_BasePipelineEvent).pipeline.internal.
  super___shared_ptr<duckdb::Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_18.internal.super___shared_ptr<duckdb::Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (this->super_BasePipelineEvent).pipeline.internal.
  super___shared_ptr<duckdb::Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_18.internal.super___shared_ptr<duckdb::Pipeline,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  (this->super_BasePipelineEvent).super_Event._vptr_Event =
       (_func_int **)&PTR__BasePipelineEvent_019a4218;
  return;
}

Assistant:

PipelineEvent::PipelineEvent(shared_ptr<Pipeline> pipeline_p) : BasePipelineEvent(std::move(pipeline_p)) {
}